

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_closeCStream(HUF_CStream_t *bitC)

{
  HUF_CElt elt;
  size_t sVar1;
  void *memPtr;
  ulong uVar2;
  ulong *in_RDI;
  size_t nbBits_1;
  size_t bitContainer;
  size_t nbBytes;
  size_t nbBits;
  size_t in_stack_ffffffffffffff88;
  size_t local_48;
  
  elt = HUF_endMark();
  sVar1 = HUF_getNbBits(elt);
  if (0xc < sVar1) {
    __assert_fail("HUF_getNbBits(elt) <= HUF_TABLELOG_ABSOLUTEMAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3e2b,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
  }
  sVar1 = HUF_getNbBits(elt);
  *in_RDI = *in_RDI >> ((byte)sVar1 & 0x3f);
  memPtr = (void *)HUF_getValue(elt);
  *in_RDI = (ulong)memPtr | *in_RDI;
  sVar1 = HUF_getNbBitsFast(elt);
  in_RDI[2] = sVar1 + in_RDI[2];
  if (0x40 < (in_RDI[2] & 0xff)) {
    __assert_fail("(bitC->bitPos[idx] & 0xFF) <= HUF_BITS_IN_CONTAINER",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3e37,"void HUF_addBits(HUF_CStream_t *, HUF_CElt, int, int)");
  }
  uVar2 = in_RDI[2] & 0xff;
  in_RDI[2] = in_RDI[2] & 7;
  if (uVar2 == 0) {
    __assert_fail("nbBits > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3e6d,"void HUF_flushBits(HUF_CStream_t *, int)");
  }
  if (uVar2 < 0x41) {
    if (in_RDI[5] <= in_RDI[6]) {
      MEM_writeLEST(memPtr,in_stack_ffffffffffffff88);
      in_RDI[5] = (uVar2 >> 3) + in_RDI[5];
      if (in_RDI[6] < in_RDI[5]) {
        in_RDI[5] = in_RDI[6];
      }
      if (in_RDI[5] < in_RDI[6]) {
        local_48 = (in_RDI[5] - in_RDI[4]) + (long)(int)(uint)((in_RDI[2] & 0xff) != 0);
      }
      else {
        local_48 = 0;
      }
      return local_48;
    }
    __assert_fail("bitC->ptr <= bitC->endPtr",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3e6f,"void HUF_flushBits(HUF_CStream_t *, int)");
  }
  __assert_fail("nbBits <= sizeof(bitC->bitContainer[0]) * 8",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x3e6e,"void HUF_flushBits(HUF_CStream_t *, int)");
}

Assistant:

static size_t HUF_closeCStream(HUF_CStream_t* bitC)
{
    HUF_addBits(bitC, HUF_endMark(), /* idx */ 0, /* kFast */ 0);
    HUF_flushBits(bitC, /* kFast */ 0);
    {
        size_t const nbBits = bitC->bitPos[0] & 0xFF;
        if (bitC->ptr >= bitC->endPtr) return 0; /* overflow detected */
        return (size_t)(bitC->ptr - bitC->startPtr) + (nbBits > 0);
    }
}